

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O1

bool __thiscall
tinyusdz::GeomPrimvar::get_value<tinyusdz::value::color4f>
          (GeomPrimvar *this,color4f *dest,string *err)

{
  Attribute *this_00;
  long lVar1;
  vtable_type *pvVar2;
  pointer pSVar3;
  void *pvVar4;
  void *pvVar5;
  uint32_t uVar6;
  color4f *pcVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  bool bVar8;
  bool bVar9;
  undefined3 local_b0;
  undefined4 uStack_ad;
  float fStack_a9;
  float fStack_a5;
  undefined4 uStack_a1;
  undefined5 uStack_9d;
  undefined1 local_90 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_80;
  undefined1 local_6c [20];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  anon_struct_4_0_00000001_for___align local_45;
  float fStack_41;
  float fStack_3d;
  float fStack_39;
  
  if (dest == (color4f *)0x0) {
joined_r0x001cfdda:
    if (err != (string *)0x0) {
      std::__cxx11::string::append((char *)err);
    }
  }
  else {
    if ((this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pvVar2 = (this->_attr)._var._value.v_.vtable;
      if (pvVar2 == (vtable_type *)0x0) {
        bVar8 = false;
      }
      else {
        uVar6 = (*pvVar2->type_id)();
        bVar8 = uVar6 == 4;
      }
      if ((bVar8) || (((this->_attr)._var._blocked & 1U) != 0)) goto joined_r0x001cfdda;
    }
    if (((this->_attr)._var._blocked == false) &&
       (((pvVar2 = (this->_attr)._var._value.v_.vtable, pvVar2 != (vtable_type *)0x0 &&
         (uVar6 = (*pvVar2->type_id)(), uVar6 == 0)) ||
        ((pvVar2 = (this->_attr)._var._value.v_.vtable, pvVar2 != (vtable_type *)0x0 &&
         (uVar6 = (*pvVar2->type_id)(), uVar6 == 1)))))) {
      if ((this->_attr)._var._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->_attr)._var._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        bVar9 = (this->_attr)._var._ts._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                (this->_attr)._var._ts._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish;
        bVar8 = !bVar9;
        if (bVar9) {
          if (err == (string *)0x0) {
            return bVar8;
          }
          std::__cxx11::string::append((char *)err);
          return bVar8;
        }
        if ((this->_attr)._var._ts._dirty == true) {
          tinyusdz::value::TimeSamples::update(&(this->_attr)._var._ts);
        }
        pSVar3 = (this->_attr)._var._ts._samples.
                 super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((this->_attr)._var._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish == pSVar3) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
        }
        pcVar7 = tinyusdz::value::Value::as<tinyusdz::value::color4f>(&pSVar3->value,false);
        if (pcVar7 != (color4f *)0x0) {
          local_45 = (anon_struct_4_0_00000001_for___align)pcVar7->r;
          fStack_41 = pcVar7->g;
          fStack_3d = pcVar7->b;
          fStack_39 = pcVar7->a;
          local_90[0] = bVar8;
          goto LAB_001cfefb;
        }
      }
    }
    else {
      this_00 = &this->_attr;
      uVar6 = Attribute::type_id(this_00);
      bVar8 = IsSupportedGeomPrimvarType(uVar6);
      if (bVar8) {
        primvar::PrimVar::get_value<tinyusdz::value::color4f>
                  ((optional<tinyusdz::value::color4f> *)local_90,&(this->_attr)._var);
        if ((bool)local_90[0] == true) {
          fStack_a9 = (float)local_90._8_4_;
          fStack_a5 = (float)local_90._12_4_;
          uStack_a1 = (float)aStack_80._M_allocated_capacity._0_4_;
          local_45 = (anon_struct_4_0_00000001_for___align)local_90._4_4_;
          fStack_41 = (float)local_90._8_4_;
          fStack_3d = (float)local_90._12_4_;
          fStack_39 = (float)aStack_80._M_allocated_capacity._0_4_;
        }
        if ((bool)local_90[0] == false) {
          if (err == (string *)0x0) {
            return false;
          }
          lVar1 = (long)&uStack_a1 + 1;
          local_b0 = (undefined3)lVar1;
          uStack_ad = (undefined4)((ulong)lVar1 >> 0x18);
          fStack_a9._0_1_ = (undefined1)((ulong)lVar1 >> 0x38);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,
                     "Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`"
                     ,"");
          local_6c._0_4_ = 0x3d;
          Attribute::type_name_abi_cxx11_((string *)(local_6c + 4),this_00);
          fmt::format<unsigned_int,std::__cxx11::string>
                    ((string *)local_90,(fmt *)&local_b0,(string *)local_6c,(uint *)(local_6c + 4),
                     in_R8);
          std::__cxx11::string::_M_append((char *)err,CONCAT44(local_90._4_4_,local_90._0_4_));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_90._4_4_,local_90._0_4_) != &aStack_80) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_90._4_4_,local_90._0_4_),
                            CONCAT44(aStack_80._M_allocated_capacity._4_4_,
                                     aStack_80._M_allocated_capacity._0_4_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6c._4_8_ != &local_58) {
            operator_delete((void *)local_6c._4_8_,local_58._M_allocated_capacity + 1);
          }
          pvVar5 = (void *)CONCAT17(fStack_a9._0_1_,CONCAT43(uStack_ad,local_b0));
          if (pvVar5 == (void *)((long)&uStack_a1 + 1)) {
            return false;
          }
          operator_delete(pvVar5,CONCAT53(uStack_9d,uStack_a1._1_3_) + 1);
          return false;
        }
LAB_001cfefb:
        dest->r = (float)local_45;
        dest->g = fStack_41;
        dest->b = fStack_3d;
        dest->a = fStack_39;
        return (bool)local_90[0];
      }
      if (err != (string *)0x0) {
        pvVar5 = (void *)((long)&uStack_a1 + 1);
        local_b0 = SUB83(pvVar5,0);
        uStack_ad = (undefined4)((ulong)pvVar5 >> 0x18);
        fStack_a9._0_1_ = (undefined1)((ulong)pvVar5 >> 0x38);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"Unsupported type for GeomPrimvar. type = `{}`","");
        Attribute::type_name_abi_cxx11_((string *)(local_6c + 4),this_00);
        fmt::format<std::__cxx11::string>
                  ((string *)local_90,(fmt *)&local_b0,(string *)(local_6c + 4),in_RCX);
        std::__cxx11::string::_M_append((char *)err,CONCAT44(local_90._4_4_,local_90._0_4_));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_90._4_4_,local_90._0_4_) != &aStack_80) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_90._4_4_,local_90._0_4_),
                          CONCAT44(aStack_80._M_allocated_capacity._4_4_,
                                   aStack_80._M_allocated_capacity._0_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6c._4_8_ != &local_58) {
          operator_delete((void *)local_6c._4_8_,local_58._M_allocated_capacity + 1);
        }
        pvVar4 = (void *)CONCAT17(fStack_a9._0_1_,CONCAT43(uStack_ad,local_b0));
        if (pvVar4 != pvVar5) {
          operator_delete(pvVar4,CONCAT53(uStack_9d,uStack_a1._1_3_) + 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool GeomPrimvar::get_value(T *dest, std::string *err) const {
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<value::token>::type_id(), "`token` type is not supported as a GeomPrimvar");
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<std::vector<value::token>>::type_id(), "`token[]` type is not supported as a GeomPrimvar");

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is blocked.";
    }
    return false;
  }

  if (_attr.has_value()) {
    if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
      if (err) {
        (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                              _attr.type_name());
      }
      return false;
    }

    if (auto pv = _attr.get_value<T>()) {

      // copy
      (*dest) = pv.value();
      return true;

    } else {
      if (err) {
        (*err) += fmt::format("Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`", value::TypeTraits<T>::type_id(), _attr.type_name());
      }
      return false;
    }
  }

  if (_attr.has_timesamples()) {
    // Return the first sample.
    const auto &ts = _attr.get_var().ts_raw();
    if (ts.empty()) {
      if (err) {
        (*err) += "No TimeSample value in Attribute..";
      }
      return false;
    }
    
    if (auto pv =ts.get_samples().at(0).value.as<T>()) {
      (*dest) = (*pv);
      return true;
    }
  }

  return false;
}